

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O3

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::
Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
::~Iterator(Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
            *this)

{
  int *piVar1;
  long *plVar2;
  BacktrackData *pBVar3;
  IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>
  *pIVar4;
  Value VVar5;
  uint *puVar6;
  ulong uVar7;
  VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>
  *pVVar8;
  VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>
  *pVVar9;
  
  reset(this);
  pBVar3 = (this->_bdStack)._stack;
  if (pBVar3 != (BacktrackData *)0x0) {
    uVar7 = (this->_bdStack)._capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar7 == 0) {
      pBVar3->_boList = (BacktrackObject *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pBVar3;
    }
    else if (uVar7 < 0x11) {
      pBVar3->_boList = (BacktrackObject *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pBVar3;
    }
    else if (uVar7 < 0x19) {
      pBVar3->_boList = (BacktrackObject *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = pBVar3;
    }
    else if (uVar7 < 0x21) {
      pBVar3->_boList = (BacktrackObject *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pBVar3;
    }
    else if (uVar7 < 0x31) {
      pBVar3->_boList = (BacktrackObject *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pBVar3;
    }
    else if (uVar7 < 0x41) {
      pBVar3->_boList = (BacktrackObject *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pBVar3;
    }
    else {
      operator_delete(pBVar3,0x10);
    }
  }
  pVVar8 = (this->_nodeIterators)._stack;
  for (pVVar9 = (this->_nodeIterators)._cursor; pVVar9 != pVVar8; pVVar9 = pVVar9 + -1) {
    pIVar4 = pVVar9[-1]._core;
    if (pIVar4 != (IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>
                   *)0x0) {
      piVar1 = &pIVar4->_refCnt;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (*pIVar4->_vptr_IteratorCore[1])(pIVar4);
        pVVar8 = (this->_nodeIterators)._stack;
      }
    }
  }
  if (pVVar8 != (VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>
                 *)0x0) {
    uVar7 = (this->_nodeIterators)._capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar7 == 0) {
      pVVar8->_core =
           (IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>
            *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pVVar8;
    }
    else if (uVar7 < 0x11) {
      pVVar8->_core =
           (IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>
            *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pVVar8;
    }
    else if (uVar7 < 0x19) {
      pVVar8->_core =
           (IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>
            *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = pVVar8;
    }
    else if (uVar7 < 0x21) {
      pVVar8->_core =
           (IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>
            *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pVVar8;
    }
    else if (uVar7 < 0x31) {
      pVVar8->_core =
           (IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>
            *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pVVar8;
    }
    else if (uVar7 < 0x41) {
      pVVar8->_core =
           (IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>
            *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pVVar8;
    }
    else {
      operator_delete(pVVar8,0x10);
    }
  }
  if (((this->_leafData).
       super_OptionBase<Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*>_>.
       _isSome == true) &&
     (VVar5 = (this->_leafData).
              super_OptionBase<Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*>_>
              ._elem._elem, VVar5 != (Value)0x0)) {
    plVar2 = (long *)((long)VVar5 + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)VVar5 + 8))();
    }
  }
  puVar6 = (this->_svStack)._stack;
  if (puVar6 != (uint *)0x0) {
    uVar7 = (this->_svStack)._capacity * 4 + 0xf & 0xfffffffffffffff0;
    if (uVar7 == 0) {
      *(undefined8 *)puVar6 = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = puVar6;
    }
    else if (uVar7 < 0x11) {
      *(undefined8 *)puVar6 = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = puVar6;
    }
    else if (uVar7 < 0x19) {
      *(undefined8 *)puVar6 = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = puVar6;
    }
    else if (uVar7 < 0x21) {
      *(undefined8 *)puVar6 = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = puVar6;
    }
    else if (uVar7 < 0x31) {
      *(undefined8 *)puVar6 = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = puVar6;
    }
    else {
      if (0x40 < uVar7) {
        operator_delete(puVar6,0x10);
        return;
      }
      *(undefined8 *)puVar6 = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = puVar6;
    }
  }
  return;
}

Assistant:

~Iterator()
      { reset(); }